

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

StreamOut * prvTidyBufferOutput(TidyDocImpl *doc,TidyBuffer *buf,int encoding,uint nl)

{
  StreamOut *pSVar1;
  
  pSVar1 = initStreamOut(doc,encoding,nl);
  tidyInitOutputBuffer(&pSVar1->sink,buf);
  pSVar1->iotype = BufferIO;
  return pSVar1;
}

Assistant:

StreamOut* TY_(BufferOutput)( TidyDocImpl *doc, TidyBuffer* buf, int encoding, uint nl )
{
    StreamOut* out = initStreamOut( doc, encoding, nl );
    tidyInitOutputBuffer( &out->sink, buf );
    out->iotype = BufferIO;
    return out;
}